

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

void __thiscall
duckdb::CSVErrorHandler::ErrorIfTypeExists(CSVErrorHandler *this,CSVErrorType error_type)

{
  int iVar1;
  int extraout_EAX;
  CSVError *csv_error;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    csv_error = (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
                super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
                super__Vector_impl_data._M_start;
    while( true ) {
      if (csv_error ==
          (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
          super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pthread_mutex_unlock((pthread_mutex_t *)this);
        return;
      }
      if (csv_error->type == error_type) break;
      csv_error = csv_error + 1;
    }
    ThrowError(this,csv_error);
    iVar1 = extraout_EAX;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void CSVErrorHandler::ErrorIfTypeExists(CSVErrorType error_type) {
	lock_guard<mutex> parallel_lock(main_mutex);
	for (auto &error : errors) {
		if (error.type == error_type) {
			// If it's a maximum line size error, we can do it now.
			ThrowError(error);
		}
	}
}